

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QThemeIconInfo * __thiscall QIconLoader::lookupFallbackIcon(QIconLoader *this,QString *iconName)

{
  bool bVar1;
  QString *pQVar2;
  ulong uVar3;
  pointer pQVar4;
  QStringBuilder<const_QString_&,_QLatin1String> *in_RDX;
  long in_RSI;
  QThemeIconInfo *in_RDI;
  long in_FS_OFFSET;
  QString *iconDir;
  QStringList *__range1;
  QThemeIconInfo *info;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> iconEntry;
  QDir currentDir;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList searchPaths;
  QString svgIconName;
  QString xpmIconName;
  QString pngIconName;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffdf8;
  QThemeIconInfo *in_stack_fffffffffffffe00;
  QStringBuilder<const_QString_&,_QLatin1String> *this_00;
  QString *in_stack_fffffffffffffe08;
  QStringBuilder<const_QString_&,_QLatin1String> *this_01;
  QThemeIconInfo *this_02;
  int local_1d4;
  QStringBuilder<const_QString_&,_QLatin1String> *pQVar5;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 *local_140;
  undefined1 *local_138;
  QString *local_130;
  const_iterator local_128;
  const_iterator local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  QLatin1StringView local_100;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  QLatin1StringView local_c0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  QLatin1StringView local_80;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_02 = in_RDI;
  lcIconLoader();
  anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a12c5);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffe08,
               (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),(char *)in_stack_fffffffffffffdf8,
               (char *)0x2a12de);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)this_02,(char *)in_RDX);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffe08);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  memset(in_RDI,0,0x30);
  (in_RDI->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->iconName).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->iconName).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->iconName).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QThemeIconInfo::QThemeIconInfo(in_stack_fffffffffffffe00);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDX;
  local_80 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
  ::operator+((QString *)in_stack_fffffffffffffe00,(QLatin1String *)in_RDX);
  ::QStringBuilder::operator_cast_to_QString(in_RDX);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = this_00;
  local_c0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe08,(size_t)this_00);
  ::operator+((QString *)this_00,(QLatin1String *)in_RDX);
  ::QStringBuilder::operator_cast_to_QString(in_RDX);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = this_01;
  local_100 = Qt::Literals::StringLiterals::operator____L1((char *)this_01,(size_t)this_00);
  ::operator+((QString *)this_00,(QLatin1String *)in_RDX);
  ::QStringBuilder::operator_cast_to_QString(in_RDX);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  QIcon::fallbackSearchPaths();
  local_120.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_120 = QList<QString>::begin((QList<QString> *)this_00);
  local_128.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = QList<QString>::end((QList<QString> *)this_00);
  while( true ) {
    local_130 = local_128.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_120,local_128);
    if (!bVar1) break;
    pQVar2 = QList<QString>::const_iterator::operator*(&local_120);
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_138,(QString *)pQVar2);
    local_140 = &DAT_aaaaaaaaaaaaaaaa;
    std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>::
    unique_ptr<std::default_delete<QIconLoaderEngineEntry>,void>
              ((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
               this_00);
    uVar3 = QDir::exists((QString *)&local_138);
    if ((uVar3 & 1) == 0) {
      uVar3 = QDir::exists((QString *)&local_138);
      if ((uVar3 & 1) == 0) {
        if (((*(byte *)(in_RSI + 0x18) & 1) != 0) &&
           (uVar3 = QDir::exists((QString *)&local_138), (uVar3 & 1) != 0)) {
          std::make_unique<ScalableEntry>();
          std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>::
          operator=((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                     *)this_00,
                    (unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)in_RDX);
          std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::~unique_ptr
                    ((unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)this_00);
          pQVar4 = std::
                   unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                   ::operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                                 *)0x2a181d);
          (pQVar4->dir).type = Fallback;
          QDir::filePath((QString *)local_1a0);
          std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
          operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                      *)0x2a1848);
          QString::operator=((QString *)this_00,(QString *)in_RDX);
          QString::~QString((QString *)0x2a1863);
        }
      }
      else {
        std::make_unique<PixmapEntry>();
        std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>::
        operator=((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                   *)this_00,(unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)in_RDX);
        std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                  ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)this_00);
        pQVar4 = std::
                 unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
                 operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                             *)0x2a1760);
        (pQVar4->dir).type = Fallback;
        QDir::filePath((QString *)local_180);
        std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
        operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                    *)0x2a178e);
        QString::operator=((QString *)this_00,(QString *)in_RDX);
        QString::~QString((QString *)0x2a17af);
      }
    }
    else {
      std::make_unique<PixmapEntry>();
      std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>::operator=
                ((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *
                 )this_00,(unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)in_RDX);
      std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)this_00);
      pQVar4 = std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
               ::operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                             *)0x2a16b2);
      (pQVar4->dir).type = Fallback;
      QDir::filePath((QString *)local_160);
      std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
      operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *
                 )0x2a16e0);
      QString::operator=((QString *)this_00,(QString *)in_RDX);
      QString::~QString((QString *)0x2a1701);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                        *)0x2a1874);
    if (bVar1) {
      std::
      vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ::push_back((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                   *)this_00,(value_type *)in_RDX);
      local_1d4 = 5;
    }
    else {
      local_1d4 = 0;
    }
    std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
    ~unique_ptr((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
                this_00);
    QDir::~QDir((QDir *)&local_138);
    if (local_1d4 != 0) break;
    QList<QString>::const_iterator::operator++(&local_120);
  }
  bVar1 = std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                   *)this_01);
  if (!bVar1) {
    QString::operator=(&in_RDI->iconName,(QString *)pQVar5);
  }
  QList<QString>::~QList((QList<QString> *)0x2a1913);
  QString::~QString((QString *)0x2a1920);
  QString::~QString((QString *)0x2a192d);
  QString::~QString((QString *)0x2a193a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_02;
  }
  __stack_chk_fail();
}

Assistant:

QThemeIconInfo QIconLoader::lookupFallbackIcon(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Looking up fallback icon" << iconName;

    QThemeIconInfo info;

    const QString pngIconName = iconName + ".png"_L1;
    const QString xpmIconName = iconName + ".xpm"_L1;
    const QString svgIconName = iconName + ".svg"_L1;

    const auto searchPaths = QIcon::fallbackSearchPaths();
    for (const QString &iconDir: searchPaths) {
        QDir currentDir(iconDir);
        std::unique_ptr<QIconLoaderEngineEntry> iconEntry;
        if (currentDir.exists(pngIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(pngIconName);
        } else if (currentDir.exists(xpmIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(xpmIconName);
        } else if (m_supportsSvg &&
                   currentDir.exists(svgIconName)) {
            iconEntry = std::make_unique<ScalableEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(svgIconName);
        }
        if (iconEntry) {
            info.entries.push_back(std::move(iconEntry));
            break;
        }
    }

    if (!info.entries.empty())
        info.iconName = iconName;

    return info;
}